

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<int> *this;
  allocator<std::vector<int,_std::allocator<int>_>_> *this_00;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_11;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  vector<int,_std::allocator<int>_> *local_760;
  uint local_68c;
  seconds sStack_688;
  uint32_t i;
  undefined4 local_680;
  uint local_67c;
  undefined1 local_678 [4];
  uint32_t count;
  vector<astar::Point,_std::allocator<astar::Point>_> path;
  Point end;
  Point start;
  AStar aStar;
  int local_5c8 [14];
  iterator local_590;
  size_type local_588;
  allocator<int> local_579;
  int local_578 [14];
  iterator local_540;
  size_type local_538;
  allocator<int> local_529;
  int local_528 [14];
  iterator local_4f0;
  size_type local_4e8;
  allocator<int> local_4d9;
  int local_4d8 [14];
  iterator local_4a0;
  size_type local_498;
  allocator<int> local_489;
  int local_488 [14];
  iterator local_450;
  size_type local_448;
  allocator<int> local_439;
  int local_438 [14];
  iterator local_400;
  size_type local_3f8;
  allocator<int> local_3e9;
  int local_3e8 [14];
  iterator local_3b0;
  size_type local_3a8;
  allocator<int> local_399;
  int local_398 [14];
  iterator local_360;
  size_type local_358;
  allocator<int> local_349;
  int local_348 [14];
  iterator local_310;
  size_type local_308;
  allocator<int> local_2f9;
  int local_2f8 [14];
  iterator local_2c0;
  size_type local_2b8;
  allocator<int> local_2a9;
  int local_2a8 [14];
  iterator local_270;
  size_type local_268;
  allocator<int> local_249;
  int local_248 [12];
  iterator local_218;
  size_type local_210;
  vector<int,_std::allocator<int>_> *local_208;
  vector<int,_std::allocator<int>_> local_200;
  vector<int,_std::allocator<int>_> local_1e8;
  vector<int,_std::allocator<int>_> local_1d0;
  vector<int,_std::allocator<int>_> local_1b8;
  vector<int,_std::allocator<int>_> local_1a0;
  vector<int,_std::allocator<int>_> local_188;
  vector<int,_std::allocator<int>_> local_170;
  vector<int,_std::allocator<int>_> local_158;
  vector<int,_std::allocator<int>_> local_140;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  undefined1 local_e0 [40];
  undefined1 local_b8 [8];
  Map maze;
  AStar as;
  char **argv_local;
  int argc_local;
  
  astar::AStar::AStar((AStar *)&maze.m,D8);
  aStar.closeZone._M_h._M_single_bucket._6_1_ = 1;
  local_248[8] = 0;
  local_248[9] = 0;
  local_248[10] = 0;
  local_248[0xb] = 0;
  local_248[4] = 0;
  local_248[5] = 0;
  local_248[6] = 0;
  local_248[7] = 0;
  local_248[0] = 0;
  local_248[1] = 0;
  local_248[2] = 0;
  local_248[3] = 0;
  local_218 = local_248;
  local_210 = 0xc;
  local_208 = &local_200;
  std::allocator<int>::allocator(&local_249);
  __l_10._M_len = local_210;
  __l_10._M_array = local_218;
  std::vector<int,_std::allocator<int>_>::vector(&local_200,__l_10,&local_249);
  local_2a8[8] = 0;
  local_2a8[9] = 0;
  local_2a8[10] = 0;
  local_2a8[0xb] = 0;
  local_2a8[4] = 0;
  local_2a8[5] = 0;
  local_2a8[6] = 0;
  local_2a8[7] = 0;
  local_2a8[0] = 0;
  local_2a8[1] = 0;
  local_2a8[2] = 0;
  local_2a8[3] = 0;
  local_270 = local_2a8;
  local_268 = 0xc;
  local_208 = &local_1e8;
  std::allocator<int>::allocator(&local_2a9);
  __l_09._M_len = local_268;
  __l_09._M_array = local_270;
  std::vector<int,_std::allocator<int>_>::vector(&local_1e8,__l_09,&local_2a9);
  local_2f8[8] = 1;
  local_2f8[9] = 1;
  local_2f8[10] = 1;
  local_2f8[0xb] = 0;
  local_2f8[4] = 1;
  local_2f8[5] = 1;
  local_2f8[6] = 0;
  local_2f8[7] = 0;
  local_2f8[0] = 0;
  local_2f8[1] = 0;
  local_2f8[2] = 1;
  local_2f8[3] = 1;
  local_2c0 = local_2f8;
  local_2b8 = 0xc;
  local_208 = &local_1d0;
  std::allocator<int>::allocator(&local_2f9);
  __l_08._M_len = local_2b8;
  __l_08._M_array = local_2c0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,__l_08,&local_2f9);
  local_348[8] = 0;
  local_348[9] = 0;
  local_348[10] = 1;
  local_348[0xb] = 0;
  local_348[4] = 0;
  local_348[5] = 0;
  local_348[6] = 0;
  local_348[7] = 0;
  local_348[0] = 0;
  local_348[1] = 0;
  local_348[2] = 1;
  local_348[3] = 0;
  local_310 = local_348;
  local_308 = 0xc;
  local_208 = &local_1b8;
  std::allocator<int>::allocator(&local_349);
  __l_07._M_len = local_308;
  __l_07._M_array = local_310;
  std::vector<int,_std::allocator<int>_>::vector(&local_1b8,__l_07,&local_349);
  local_398[8] = 0;
  local_398[9] = 0;
  local_398[10] = 1;
  local_398[0xb] = 0;
  local_398[4] = 0;
  local_398[5] = 0;
  local_398[6] = 1;
  local_398[7] = 0;
  local_398[0] = 0;
  local_398[1] = 0;
  local_398[2] = 1;
  local_398[3] = 0;
  local_360 = local_398;
  local_358 = 0xc;
  local_208 = &local_1a0;
  std::allocator<int>::allocator(&local_399);
  __l_06._M_len = local_358;
  __l_06._M_array = local_360;
  std::vector<int,_std::allocator<int>_>::vector(&local_1a0,__l_06,&local_399);
  local_3e8[8] = 0;
  local_3e8[9] = 0;
  local_3e8[10] = 1;
  local_3e8[0xb] = 0;
  local_3e8[4] = 0;
  local_3e8[5] = 0;
  local_3e8[6] = 1;
  local_3e8[7] = 0;
  local_3e8[0] = 0;
  local_3e8[1] = 0;
  local_3e8[2] = 0;
  local_3e8[3] = 0;
  local_3b0 = local_3e8;
  local_3a8 = 0xc;
  local_208 = &local_188;
  std::allocator<int>::allocator(&local_3e9);
  __l_05._M_len = local_3a8;
  __l_05._M_array = local_3b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_188,__l_05,&local_3e9);
  local_438[8] = 0;
  local_438[9] = 0;
  local_438[10] = 0;
  local_438[0xb] = 0;
  local_438[4] = 0;
  local_438[5] = 0;
  local_438[6] = 1;
  local_438[7] = 0;
  local_438[0] = 0;
  local_438[1] = 0;
  local_438[2] = 1;
  local_438[3] = 0;
  local_400 = local_438;
  local_3f8 = 0xc;
  local_208 = &local_170;
  std::allocator<int>::allocator(&local_439);
  __l_04._M_len = local_3f8;
  __l_04._M_array = local_400;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_04,&local_439);
  local_488[8] = 0;
  local_488[9] = 0;
  local_488[10] = 1;
  local_488[0xb] = 0;
  local_488[4] = 0;
  local_488[5] = 0;
  local_488[6] = 1;
  local_488[7] = 0;
  local_488[0] = 0;
  local_488[1] = 0;
  local_488[2] = 1;
  local_488[3] = 0;
  local_450 = local_488;
  local_448 = 0xc;
  local_208 = &local_158;
  std::allocator<int>::allocator(&local_489);
  __l_03._M_len = local_448;
  __l_03._M_array = local_450;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_03,&local_489);
  local_4d8[8] = 0;
  local_4d8[9] = 0;
  local_4d8[10] = 1;
  local_4d8[0xb] = 0;
  local_4d8[4] = 0;
  local_4d8[5] = 0;
  local_4d8[6] = 0;
  local_4d8[7] = 0;
  local_4d8[0] = 0;
  local_4d8[1] = 0;
  local_4d8[2] = 1;
  local_4d8[3] = 0;
  local_4a0 = local_4d8;
  local_498 = 0xc;
  local_208 = &local_140;
  std::allocator<int>::allocator(&local_4d9);
  __l_02._M_len = local_498;
  __l_02._M_array = local_4a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_02,&local_4d9);
  local_528[8] = 1;
  local_528[9] = 1;
  local_528[10] = 1;
  local_528[0xb] = 0;
  local_528[4] = 1;
  local_528[5] = 0;
  local_528[6] = 0;
  local_528[7] = 1;
  local_528[0] = 0;
  local_528[1] = 0;
  local_528[2] = 1;
  local_528[3] = 1;
  local_4f0 = local_528;
  local_4e8 = 0xc;
  local_208 = &local_128;
  std::allocator<int>::allocator(&local_529);
  __l_01._M_len = local_4e8;
  __l_01._M_array = local_4f0;
  std::vector<int,_std::allocator<int>_>::vector(&local_128,__l_01,&local_529);
  local_578[8] = 0;
  local_578[9] = 0;
  local_578[10] = 0;
  local_578[0xb] = 0;
  local_578[4] = 0;
  local_578[5] = 0;
  local_578[6] = 0;
  local_578[7] = 0;
  local_578[0] = 0;
  local_578[1] = 0;
  local_578[2] = 0;
  local_578[3] = 0;
  local_540 = local_578;
  local_538 = 0xc;
  local_208 = &local_110;
  std::allocator<int>::allocator(&local_579);
  __l_00._M_len = local_538;
  __l_00._M_array = local_540;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l_00,&local_579);
  local_5c8[8] = 0;
  local_5c8[9] = 0;
  local_5c8[10] = 0;
  local_5c8[0xb] = 0;
  local_5c8[4] = 0;
  local_5c8[5] = 0;
  local_5c8[6] = 0;
  local_5c8[7] = 0;
  local_5c8[0] = 0;
  local_5c8[1] = 0;
  local_5c8[2] = 0;
  local_5c8[3] = 0;
  local_590 = local_5c8;
  local_588 = 0xc;
  this = (allocator<int> *)((long)&aStar.closeZone._M_h._M_single_bucket + 7);
  local_208 = &local_f8;
  std::allocator<int>::allocator(this);
  __l._M_len = local_588;
  __l._M_array = local_590;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l,this);
  aStar.closeZone._M_h._M_single_bucket._6_1_ = 0;
  local_e0._0_8_ = &local_200;
  local_e0._8_8_ = (pointer)0xc;
  this_00 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
            ((long)&aStar.closeZone._M_h._M_single_bucket + 5);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_00);
  __l_11._M_len = local_e0._8_8_;
  __l_11._M_array = (iterator)local_e0._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_e0 + 0x10),__l_11,this_00);
  astar::Map::Map((Map *)local_b8,
                  (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)(local_e0 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_e0 + 0x10));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&aStar.closeZone._M_h._M_single_bucket + 5));
  local_760 = (vector<int,_std::allocator<int>_> *)local_e0;
  do {
    local_760 = local_760 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_760);
  } while (local_760 != &local_200);
  std::allocator<int>::~allocator
            ((allocator<int> *)((long)&aStar.closeZone._M_h._M_single_bucket + 7));
  std::allocator<int>::~allocator(&local_579);
  std::allocator<int>::~allocator(&local_529);
  std::allocator<int>::~allocator(&local_4d9);
  std::allocator<int>::~allocator(&local_489);
  std::allocator<int>::~allocator(&local_439);
  std::allocator<int>::~allocator(&local_3e9);
  std::allocator<int>::~allocator(&local_399);
  std::allocator<int>::~allocator(&local_349);
  std::allocator<int>::~allocator(&local_2f9);
  std::allocator<int>::~allocator(&local_2a9);
  std::allocator<int>::~allocator(&local_249);
  astar::AStar::AStar((AStar *)&start,D8);
  astar::AStar::LoadMap((AStar *)&start,(Map *)local_b8);
  astar::Point::Point(&end,0,0);
  astar::Point::Point((Point *)&path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,0xb,0xb);
  DefPoint((Map *)local_b8,&end,
           (Point *)&path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  astar::AStar::FindPath
            ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678,(AStar *)&start,&end,
             (Point *)&path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  local_67c = 0;
  PrintMaze((Map *)local_b8);
  bVar1 = std::vector<astar::Point,_std::allocator<astar::Point>_>::empty
                    ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"path not found");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (; uVar3 = (ulong)local_67c,
        sVar4 = std::vector<astar::Point,_std::allocator<astar::Point>_>::size
                          ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678),
        uVar3 < sVar4; local_67c = local_67c + 1) {
      sStack_688 = s<(char)49>();
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&stack0xfffffffffffff978);
      iVar2 = astar::Map::Height((Map *)local_b8);
      ClearScreen(iVar2 + 1);
      pvVar5 = std::vector<astar::Point,_std::allocator<astar::Point>_>::operator[]
                         ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678,
                          (ulong)local_67c);
      astar::Map::Assign((Map *)local_b8,pvVar5,4);
      PrintMaze((Map *)local_b8);
      ClearScreen(1);
      poVar6 = std::operator<<((ostream *)&std::cout,"(");
      pvVar5 = std::vector<astar::Point,_std::allocator<astar::Point>_>::operator[]
                         ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678,
                          (ulong)local_67c);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar5->x);
      poVar6 = std::operator<<(poVar6,", ");
      pvVar5 = std::vector<astar::Point,_std::allocator<astar::Point>_>::operator[]
                         ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678,
                          (ulong)local_67c);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar5->y);
      poVar6 = std::operator<<(poVar6,")");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    iVar2 = astar::Map::Height((Map *)local_b8);
    ClearScreen(iVar2 + 2);
    PrintMaze((Map *)local_b8);
    for (local_68c = 0;
        sVar4 = std::vector<astar::Point,_std::allocator<astar::Point>_>::size
                          ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678),
        (ulong)local_68c < sVar4 - 1; local_68c = local_68c + 1) {
      poVar6 = std::operator<<((ostream *)&std::cout,"(");
      pvVar5 = std::vector<astar::Point,_std::allocator<astar::Point>_>::operator[]
                         ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678,
                          (ulong)local_68c);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar5->x);
      poVar6 = std::operator<<(poVar6,", ");
      pvVar5 = std::vector<astar::Point,_std::allocator<astar::Point>_>::operator[]
                         ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678,
                          (ulong)local_68c);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar5->y);
      std::operator<<(poVar6,") -> ");
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"(");
    pvVar5 = std::vector<astar::Point,_std::allocator<astar::Point>_>::operator[]
                       ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678,
                        (ulong)local_68c);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar5->x);
    poVar6 = std::operator<<(poVar6,", ");
    pvVar5 = std::vector<astar::Point,_std::allocator<astar::Point>_>::operator[]
                       ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678,
                        (ulong)local_68c);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar5->y);
    poVar6 = std::operator<<(poVar6,")");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  local_680 = 1;
  std::vector<astar::Point,_std::allocator<astar::Point>_>::~vector
            ((vector<astar::Point,_std::allocator<astar::Point>_> *)local_678);
  astar::AStar::~AStar((AStar *)&start);
  astar::Map::~Map((Map *)local_b8);
  astar::AStar::~AStar((AStar *)&maze.m);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    astar::AStar as(astar::D8);

    astar::Map maze({{0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 1, 1, 1, 1, 0, 0, 1, 1, 1, 0},
                     {0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 0, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1, 0},
                     {0, 0, 1, 1, 1, 0, 0, 1, 1, 1, 1, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}});

    astar::AStar aStar(astar::D8);
    aStar.LoadMap(maze);

    astar::Point start = {0, 0};
    astar::Point end = {11, 11};
    DefPoint(maze, start, end);
    auto path = aStar.FindPath(start, end);

    // display the maze
    uint32_t count = 0;
    PrintMaze(maze);
    if (path.empty()) {
        std::cout << "path not found" << std::endl;
        return 0;
    }
    while (count < path.size()) {
        std::this_thread::sleep_for(1s);
        ClearScreen(maze.Height() + 1);
        maze.Assign(path[count], 4);
        PrintMaze(maze);
        ClearScreen(1);
        std::cout << "(" << path[count].x << ", " << path[count].y << ")" << std::endl;
        count++;
    }
    ClearScreen(maze.Height() + 2);
    PrintMaze(maze);
    uint32_t i = 0;
    for (; i < (path.size() - 1); i++) {
        std::cout << "(" << path[i].x << ", " << path[i].y << ") -> ";
    }
    std::cout << "(" << path[i].x << ", " << path[i].y << ")" << std::endl;
    return 0;
}